

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O3

int N_VInvTestLocal_ManyVector(N_Vector x,N_Vector z)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  byte bVar4;
  long lVar5;
  
  plVar3 = (long *)x->content;
  if (0 < *plVar3) {
    bVar4 = 1;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(plVar3[2] + lVar5 * 8);
      if (*(long *)(*(long *)(lVar1 + 8) + 0x160) == 0) {
        iVar2 = N_VInvTest(lVar1,*(undefined8 *)(*(long *)((long)z->content + 0x10) + lVar5 * 8));
      }
      else {
        iVar2 = N_VInvTestLocal();
      }
      bVar4 = bVar4 & iVar2 != 0;
      lVar5 = lVar5 + 1;
      plVar3 = (long *)x->content;
    } while (lVar5 < *plVar3);
    return (int)bVar4;
  }
  return 1;
}

Assistant:

sunbooleantype MVAPPEND(N_VInvTestLocal)(N_Vector x, N_Vector z)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  sunbooleantype val, subval;

  /* initialize output*/
  val = SUNTRUE;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* check for nvinvtestlocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvinvtestlocal)
    {
      subval = N_VInvTestLocal(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(z, i));
      SUNCheckLastErrNoRet();
      val = (val && subval);

      /* otherwise, call nvinvtest and accumulate to overall val */
    }
    else
    {
      subval = N_VInvTest(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(z, i));
      SUNCheckLastErrNoRet();
      val = (val && subval);
    }
  }

  return (val);
}